

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.c
# Opt level: O1

void HeapOp(void)

{
  uint uVar1;
  Chuck *pCVar2;
  byte bVar3;
  void *raw;
  Heap *heap;
  Chuck *chuck;
  Chuck *chuck_00;
  Chuck *pCVar4;
  ulong uVar5;
  ulong uVar6;
  
  raw = malloc(0x1000);
  heap = CreateHeap(raw,0x1000);
  pCVar2 = heap->head;
  if (pCVar2 != heap->last) {
    __assert_fail("heap->head == heap->last",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x4d,"void HeapOp()");
  }
  uVar5 = (ulong)(*(uint *)&pCVar2->field_0x4 >> 1);
  if (((&pCVar2->field_0x4)[uVar5 * 8] & 1) != 0) {
    __assert_fail("!GetUsed(heap->head)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x4e,"void HeapOp()");
  }
  if (pCVar2->prev != (ChuckLayout *)0x0) {
    __assert_fail("!heap->head->prev",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x4f,"void HeapOp()");
  }
  if (pCVar2->next != (ChuckLayout *)0x0) {
    __assert_fail("!heap->head->next",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x50,"void HeapOp()");
  }
  if (*(uint *)&pCVar2->field_0x4 < 2) {
    __assert_fail("GetSize(heap->head) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x51,"void HeapOp()");
  }
  bVar3 = MatchSorted(uVar5 << 3);
  uVar5 = 0;
  do {
    if (heap->exact[uVar5] != (Chuck *)0x0) {
      __assert_fail("!heap->exact[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                    ,0x55,"void HeapOp()");
    }
    if (bVar3 == uVar5) {
      if (heap->sorted[uVar5] != heap->head) {
        __assert_fail("heap->sorted[i] == heap->head",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                      ,0x5c,"void HeapOp()");
      }
    }
    else if (heap->sorted[uVar5] != (Chuck *)0x0) {
      __assert_fail("!heap->sorted[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                    ,0x58,"void HeapOp()");
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x40);
  pCVar2 = heap->head;
  MoveOut(heap,pCVar2);
  if (heap->head != (Chuck *)0x0) {
    __assert_fail("!heap->head",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x62,"void HeapOp()");
  }
  if (heap->last != (Chuck *)0x0) {
    __assert_fail("!heap->last",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,99,"void HeapOp()");
  }
  MoveIn(heap,pCVar2);
  if (heap->head != pCVar2) {
    __assert_fail("heap->head == ck",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x65,"void HeapOp()");
  }
  if (heap->last != pCVar2) {
    __assert_fail("heap->last == ck",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x66,"void HeapOp()");
  }
  MoveOut(heap,pCVar2);
  chuck = SplitIfWorthy(pCVar2,0x80);
  chuck_00 = SplitIfWorthy(chuck,0x40);
  SplitIfWorthy(chuck_00,0x100);
  MoveIn(heap,pCVar2);
  MoveIn(heap,chuck_00);
  if (heap->head != pCVar2) {
    __assert_fail("heap->head == ck1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x6f,"void HeapOp()");
  }
  if (pCVar2->prev != (ChuckLayout *)0x0) {
    __assert_fail("ck1->prev == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x70,"void HeapOp()");
  }
  if (pCVar2->next != chuck_00) {
    __assert_fail("ck1->next == ck3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x71,"void HeapOp()");
  }
  if (chuck_00->next != (ChuckLayout *)0x0) {
    __assert_fail("ck3->next == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x72,"void HeapOp()");
  }
  if (heap->last != chuck_00) {
    __assert_fail("heap->last == ck3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x73,"void HeapOp()");
  }
  pCVar4 = FindSmallestFitInHeap(heap,0);
  if (pCVar4 != pCVar2) {
    __assert_fail("FindSmallestFitInHeap(heap, 0) == ck1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x74,"void HeapOp()");
  }
  uVar5 = 0;
  do {
    uVar1 = *(uint *)&pCVar2->field_0x4;
    pCVar4 = FindSmallestFitInHeap(heap,uVar5);
    if ((ulong)(uVar1 & 0xfffffffe) << 2 < uVar5) {
      if (pCVar4 != chuck_00) {
        __assert_fail("FindSmallestFitInHeap(heap, size) == ck3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                      ,0x7d,"void HeapOp()");
      }
    }
    else if (pCVar4 != pCVar2) {
      __assert_fail("FindSmallestFitInHeap(heap, size) == ck1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                    ,0x79,"void HeapOp()");
    }
    uVar5 = uVar5 + 8;
    uVar6 = (ulong)(*(uint *)&chuck_00->field_0x4 & 0xfffffffe) * 4;
  } while (uVar5 <= uVar6);
  pCVar4 = FindSmallestFitInHeap(heap,uVar6 + 8);
  if (pCVar4 == (Chuck *)0x0) {
    MoveIn(heap,chuck);
    if (heap->head != chuck) {
      __assert_fail("heap->head == ck2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                    ,0x83,"void HeapOp()");
    }
    if (chuck->next != pCVar2) {
      __assert_fail("ck2->next == ck1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                    ,0x84,"void HeapOp()");
    }
    MoveOut(heap,pCVar2);
    if (chuck->next != chuck_00) {
      __assert_fail("ck2->next == ck3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                    ,0x86,"void HeapOp()");
    }
    MoveOut(heap,chuck_00);
    if (chuck->next == (ChuckLayout *)0x0) {
      if (heap->last == chuck) {
        free(raw);
        return;
      }
      __assert_fail("heap->last == ck2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                    ,0x89,"void HeapOp()");
    }
    __assert_fail("ck2->next == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x88,"void HeapOp()");
  }
  __assert_fail("FindSmallestFitInHeap(heap, GetSize(ck3) + 8) == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                ,0x80,"void HeapOp()");
}

Assistant:

void HeapOp()
{
    Raw raw = malloc(sizeof(uint8_t) * 4096);
    Heap *heap = CreateHeap(raw, 4096);

    assert(heap->head == heap->last);
    assert(!GetUsed(heap->head));
    assert(!heap->head->prev);
    assert(!heap->head->next);
    assert(GetSize(heap->head) > 0);
    uint8_t slot = MatchSorted(GetSize(heap->head));
    for (int i = 0; i < 64; i += 1)
    {
        assert(!heap->exact[i]);
        if (i != slot)
        {
            assert(!heap->sorted[i]);
        }
        else
        {
            assert(heap->sorted[i] == heap->head);
        }
    }

    Chuck *ck = heap->head;
    MoveOut(heap, ck);
    assert(!heap->head);
    assert(!heap->last);
    MoveIn(heap, ck);
    assert(heap->head == ck);
    assert(heap->last == ck);

    MoveOut(heap, ck);
    Chuck *ck1 = ck;
    Chuck *ck2 = SplitIfWorthy(ck1, 128);
    Chuck *ck3 = SplitIfWorthy(ck2, 64);
    SplitIfWorthy(ck3, 256);
    MoveIn(heap, ck1);
    MoveIn(heap, ck3);
    assert(heap->head == ck1);
    assert(ck1->prev == NULL);
    assert(ck1->next == ck3);
    assert(ck3->next == NULL);
    assert(heap->last == ck3);
    assert(FindSmallestFitInHeap(heap, 0) == ck1);
    for (Size size = 0; size <= GetSize(ck3); size += 8)
    {
        if (size <= GetSize(ck1))
        {
            assert(FindSmallestFitInHeap(heap, size) == ck1);
        }
        else
        {
            assert(FindSmallestFitInHeap(heap, size) == ck3);
        }
    }
    assert(FindSmallestFitInHeap(heap, GetSize(ck3) + 8) == NULL);

    MoveIn(heap, ck2);
    assert(heap->head == ck2);
    assert(ck2->next == ck1);
    MoveOut(heap, ck1);
    assert(ck2->next == ck3);
    MoveOut(heap, ck3);
    assert(ck2->next == NULL);
    assert(heap->last == ck2);

    free(raw);
}